

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  Expr *pEVar1;
  ModuleField *pMVar2;
  ModuleField *pMVar3;
  ElemSegmentModuleField *pEVar4;
  bool bVar5;
  Result RVar6;
  TokenType TVar7;
  char *pcVar8;
  Enum EVar9;
  _Head_base<0UL,_wabt::Import_*,_false> _Var10;
  ElemExprVector *out_list;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  elem_segment_field;
  Type elem_type;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> table_field;
  Location loc;
  string name;
  ElemExpr elem_expr;
  ModuleFieldList export_fields;
  _Head_base<0UL,_wabt::Import_*,_false> local_140;
  Enum local_138;
  Type local_134;
  ElemSegmentModuleField *local_130;
  Location local_128;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  Location local_d8;
  string local_b8;
  ElemExpr local_98;
  ModuleFieldList local_48;
  
  RVar6 = Expect(this,Lpar);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_98,this);
  local_d8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       local_98.var.loc.filename.size_;
  local_d8.field_1._8_8_ = local_98.var.loc.field_1._0_8_;
  local_d8.filename.data_ = (char *)local_98._0_8_;
  local_d8.filename.size_ = (size_type)local_98.var.loc.filename.data_;
  RVar6 = Expect(this,Table);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ParseBindVarOpt(this,&local_b8);
  local_48.size_ = 0;
  local_48.first_ = (ModuleField *)0x0;
  local_48.last_ = (ModuleField *)0x0;
  EVar9 = Error;
  RVar6 = ParseInlineExports(this,&local_48,Table);
  pMVar3 = local_48.first_;
  if (RVar6.enum_ == Error) goto joined_r0x0016700f;
  bVar5 = PeekMatchLpar(this,Import);
  if (bVar5) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)&local_140,&local_b8);
    RVar6 = ParseInlineImport(this,local_140._M_head_impl);
    _Var10._M_head_impl = local_140._M_head_impl;
    if (((RVar6.enum_ == Error) ||
        (RVar6 = ParseLimits(this,(Limits *)
                                  &(((ElemSegment *)((long)local_140._M_head_impl + 0x40))->
                                   table_var).loc.filename.size_),
        _Var10._M_head_impl = local_140._M_head_impl, RVar6.enum_ == Error)) ||
       (RVar6 = ParseRefType(this,(Type *)&(((ElemSegment *)((long)local_140._M_head_impl + 0x40))->
                                           table_var).type_),
       _Var10._M_head_impl = local_140._M_head_impl, RVar6.enum_ == Error)) {
LAB_00166ebe:
      pMVar3 = local_48.first_;
      if ((ElemSegmentModuleField *)_Var10._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
           &((ElemSegmentModuleField *)_Var10._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField)._vptr_ModuleField
          [1])();
        pMVar3 = local_48.first_;
      }
      goto joined_r0x0016700f;
    }
    GetToken((Token *)&local_98,this);
    local_128.field_1.field_0.line = (int)local_98.var.loc.filename.size_;
    local_128.field_1.field_0.first_column = (int)(local_98.var.loc.filename.size_ >> 0x20);
    local_128.field_1.field_0.last_column = (int)local_98.var.loc.field_1._0_8_;
    local_128.field_1._12_4_ = (undefined4)((ulong)local_98.var.loc.field_1._0_8_ >> 0x20);
    local_128.filename.data_ = (char *)local_98._0_8_;
    local_128.filename.size_._0_4_ = SUB84(local_98.var.loc.filename.data_,0);
    local_128.filename.size_._4_4_ = (undefined4)((ulong)local_98.var.loc.filename.data_ >> 0x20);
    local_e0._M_head_impl = (ImportModuleField *)operator_new(0x48);
    _Var10._M_head_impl = local_140._M_head_impl;
    local_140._M_head_impl = (Import *)0x0;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001c04b0;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename.data_ = local_128.filename.data_;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename.size_ =
         CONCAT44(local_128.filename.size_._4_4_,(undefined4)local_128.filename.size_);
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.field_1.field_1.offset =
         CONCAT44(local_128.field_1.field_0.first_column,local_128.field_1.field_0.line);
    *(ulong *)((long)&((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                      super_ModuleField.loc.field_1 + 8) =
         CONCAT44(local_128.field_1._12_4_,local_128.field_1.field_0.last_column);
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    type_ = Import;
    ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001c0c50;
    ((local_e0._M_head_impl)->import)._M_t.
    super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
    super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var10._M_head_impl;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_e0);
    if (local_e0._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_e0._M_head_impl = (ImportModuleField *)0x0;
    _Var10._M_head_impl = local_140._M_head_impl;
LAB_00166fbf:
    if ((ElemSegmentModuleField *)_Var10._M_head_impl != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
         &((ElemSegmentModuleField *)_Var10._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField)._vptr_ModuleField[1]
      )();
    }
  }
  else {
    TVar7 = Peek(this,0);
    if (TVar7 != First_Type) {
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_98,&local_d8,&local_b8);
      RVar6 = ParseLimits(this,(Limits *)
                               ((long)&(((ElemSegment *)(local_98._0_8_ + 0x40))->name).field_2 + 8)
                         );
      _Var10._M_head_impl = (Import *)local_98._0_8_;
      if ((RVar6.enum_ == Error) ||
         (RVar6 = ParseRefType(this,(Type *)&(((ElemSegment *)(local_98._0_8_ + 0x40))->table_var).
                                             loc.field_1.field_0),
         _Var10._M_head_impl = (Import *)local_98._0_8_, RVar6.enum_ == Error)) goto LAB_00166ebe;
      local_100._M_head_impl = (TableModuleField *)local_98._0_8_;
      local_98._0_8_ = (ElemSegmentModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_100);
      if (local_100._M_head_impl != (TableModuleField *)0x0) {
        (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_100._M_head_impl = (TableModuleField *)0x0;
      _Var10._M_head_impl = (Import *)local_98._0_8_;
      goto LAB_00166fbf;
    }
    RVar6 = ParseRefType(this,&local_134);
    pMVar3 = local_48.first_;
    if (((RVar6.enum_ == Error) ||
        (RVar6 = Expect(this,Lpar), pMVar3 = local_48.first_, RVar6.enum_ == Error)) ||
       (RVar6 = Expect(this,Elem), pMVar3 = local_48.first_, RVar6.enum_ == Error))
    goto joined_r0x0016700f;
    MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>((wabt *)&local_140,&local_d8);
    _Var10._M_head_impl = local_140._M_head_impl;
    local_128.field_1.field_0.line = 0;
    local_128.field_1.field_0.first_column = 0;
    local_128.field_1.field_0.last_column = 0;
    local_128.filename.data_ = (char *)0x0;
    local_128.filename.size_._0_4_ = 0;
    local_128.filename.size_._4_4_ = 0;
    Var::Var((Var *)&local_98,
             (Index)((ulong)((long)(module->tables).
                                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(module->tables).
                                  super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),&local_128);
    Var::operator=(&((ElemSegment *)((long)_Var10._M_head_impl + 0x40))->table_var,(Var *)&local_98)
    ;
    Var::~Var((Var *)&local_98);
    local_130 = (ElemSegmentModuleField *)_Var10._M_head_impl;
    local_e8._M_head_impl = (Expr *)operator_new(0x88);
    ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    ((local_e8._M_head_impl)->loc).filename.data_ = (char *)0x0;
    ((local_e8._M_head_impl)->loc).filename.size_ = 0;
    *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).filename.size_ + 4) = 0;
    *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
    (local_e8._M_head_impl)->type_ = Const;
    (local_e8._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_001c0830;
    local_e8._M_head_impl[1]._vptr_Expr = (_func_int **)0x0;
    local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
    *(undefined8 *)((long)&local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ + 4)
         = 0;
    *(undefined8 *)((long)&local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4)
         = 0;
    *(undefined4 *)&local_e8._M_head_impl[1].loc.filename.size_ = 0xffffffff;
    local_e8._M_head_impl[1].loc.field_1.field_0.line = 0;
    local_e8._M_head_impl[1].type_ = AtomicLoad;
    intrusive_list<wabt::Expr>::push_back
              (&((ElemSegment *)((long)_Var10._M_head_impl + 0x40))->offset,
               (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
    if (local_e8._M_head_impl != (Expr *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_Expr[1])();
    }
    pEVar4 = local_130;
    local_e8._M_head_impl = (Expr *)0x0;
    if ((local_130->elem_segment).offset.size_ == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                    ,0x192,
                    "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                   );
    }
    pEVar1 = (local_130->elem_segment).offset.last_;
    (pEVar1->loc).field_1.field_1.offset = (size_t)local_d8.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar1->loc).field_1 + 8) = local_d8.field_1._8_8_;
    (pEVar1->loc).filename.data_ = local_d8.filename.data_;
    (pEVar1->loc).filename.size_ = local_d8.filename.size_;
    (local_130->elem_segment).elem_type.enum_ = local_134.enum_;
    local_98._0_8_ = (ulong)(uint)local_98._4_4_ << 0x20;
    local_128.field_1.field_0.line = 0;
    local_128.field_1.field_0.first_column = 0;
    local_128.field_1.field_0.last_column = 0;
    local_128.filename.data_ = (char *)0x0;
    local_128.filename.size_._0_4_ = 0;
    local_128.filename.size_._4_4_ = 0;
    Var::Var(&local_98.var,0xffffffff,&local_128);
    bVar5 = ParseElemExprOpt(this,&local_98);
    out_list = &(pEVar4->elem_segment).elem_exprs;
    if (bVar5) {
      std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back(out_list,&local_98);
      ParseElemExprListOpt(this,out_list);
    }
    else {
      ParseElemExprVarListOpt(this,out_list);
    }
    RVar6 = Expect(this,Rpar);
    if (RVar6.enum_ != Error) {
      local_138 = RVar6.enum_;
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_128,&local_d8,&local_b8);
      pcVar8 = (char *)(((long)(local_130->elem_segment).elem_exprs.
                               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_130->elem_segment).elem_exprs.
                               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)
      ;
      *(char **)((long)&(((ElemSegment *)((long)local_128.filename.data_ + 0x40))->name).field_2 + 8
                ) = pcVar8;
      (((ElemSegment *)((long)local_128.filename.data_ + 0x40))->table_var).loc.filename.data_ =
           pcVar8;
      *(bool *)&(((ElemSegment *)((long)local_128.filename.data_ + 0x40))->table_var).loc.filename.
                size_ = true;
      (((ElemSegment *)((long)local_128.filename.data_ + 0x40))->table_var).loc.field_1.field_0.line
           = local_134.enum_;
      local_f0._M_head_impl = (TableModuleField *)local_128.filename.data_;
      local_128.filename.data_ = (char *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_f0);
      if (local_f0._M_head_impl != (TableModuleField *)0x0) {
        (*((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_f0._M_head_impl = (TableModuleField *)0x0;
      local_f8._M_head_impl = (ElemSegmentModuleField *)local_140._M_head_impl;
      local_140._M_head_impl = (Import *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_f8);
      if (local_f8._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
           &(local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
      RVar6.enum_ = local_138;
      local_f8._M_head_impl = (ElemSegmentModuleField *)0x0;
      if ((ElemSegmentModuleField *)local_128.filename.data_ != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)local_128.filename.data_)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
    }
    Var::~Var(&local_98.var);
    if ((ElemSegmentModuleField *)local_140._M_head_impl != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)&(local_140._M_head_impl)->_vptr_Import)->
        super_ModuleField)._vptr_ModuleField[1])();
    }
    pMVar3 = local_48.first_;
    if (RVar6.enum_ == Error) goto joined_r0x0016700f;
  }
  anon_unknown_1::AppendInlineExportFields
            (module,&local_48,
             (int)((ulong)((long)(module->tables).
                                 super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(module->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar6 = Expect(this,Rpar);
  EVar9 = (Enum)(RVar6.enum_ == Error);
  pMVar3 = local_48.first_;
joined_r0x0016700f:
  while (pMVar3 != (ModuleField *)0x0) {
    pMVar2 = (pMVar3->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar3->_vptr_ModuleField[1])();
    pMVar3 = pMVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = MakeUnique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size());
    elem_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ElemExpr elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(elem_expr);
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = MakeUnique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = MakeUnique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}